

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  float *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::DielectricInterfaceBxDF_const&,pbrt::ConductorBxDF_const&,float_const&,pbrt::SampledSpectrum_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ LayeredBxDF top: %s bottom: %s thickness: %f albedo: %s g: %f ]",
             (char *)this,(DielectricInterfaceBxDF *)((long)this + 0xc),
             (ConductorBxDF *)((long)this + 0x34),(float *)((long)this + 0x3c),
             (SampledSpectrum *)((long)this + 0x38),in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string LayeredBxDF<TopBxDF, BottomBxDF>::ToString() const {
    return StringPrintf(
        "[ LayeredBxDF top: %s bottom: %s thickness: %f albedo: %s g: %f ]", top, bottom,
        thickness, albedo, g);
}